

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_fd.c
# Opt level: O0

int64_t file_seek(archive *a,void *client_data,int64_t request,wchar_t whence)

{
  int *piVar1;
  int64_t r;
  read_file_data *mine;
  wchar_t whence_local;
  int64_t request_local;
  void *client_data_local;
  archive *a_local;
  
  a_local = (archive *)lseek(*client_data,request,whence);
  if ((long)a_local < 0) {
    if (*(int *)((long)client_data + 0x20) == 0) {
      piVar1 = __errno_location();
      archive_set_error(a,*piVar1,"Error seeking in stdin");
    }
    else if (*(int *)((long)client_data + 0x20) == 1) {
      piVar1 = __errno_location();
      archive_set_error(a,*piVar1,"Error seeking in \'%s\'",(long)client_data + 0x24);
    }
    else {
      piVar1 = __errno_location();
      archive_set_error(a,*piVar1,"Error seeking in \'%ls\'",(long)client_data + 0x24);
    }
    a_local = (archive *)0xffffffffffffffe2;
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
file_seek(struct archive *a, void *client_data, int64_t request, int whence)
{
	struct read_fd_data *mine = (struct read_fd_data *)client_data;
	int64_t r;

	/* We use off_t here because lseek() is declared that way. */
	/* See above for notes about when off_t is less than 64 bits. */
	r = lseek(mine->fd, request, whence);
	if (r >= 0)
		return r;

	if (errno == ESPIPE) {
		archive_set_error(a, errno,
		    "A file descriptor(%d) is not seekable(PIPE)", mine->fd);
		return (ARCHIVE_FAILED);
	} else {
		/* If the input is corrupted or truncated, fail. */
		archive_set_error(a, errno,
		    "Error seeking in a file descriptor(%d)", mine->fd);
		return (ARCHIVE_FATAL);
	}
}